

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

bool __thiscall
soplex::SPxSolverBase<double>::enter(SPxSolverBase<double> *this,SPxId *enterId,bool polish)

{
  Real RVar1;
  Item *pIVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  int iVar5;
  Pricing PVar6;
  Verbosity VVar7;
  Representation RVar8;
  undefined4 extraout_var;
  SSVectorBase<double> *this_00;
  element_type *peVar9;
  double *pdVar10;
  SSVectorBase<double> *pSVar11;
  byte in_DL;
  SPxId *in_RSI;
  SPxSolverBase<double> *in_RDI;
  double dVar12;
  Real RVar13;
  double dVar14;
  double dVar15;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  SPxStatusException *E;
  Verbosity old_verbosity;
  SPxException *F;
  double leavebound;
  int i;
  int leaveIdx;
  double leaveVal;
  bool instable;
  SVectorBase<double> *enterVec;
  StableSum<double> objChange;
  double enterRO;
  Status enterStat;
  double enterPric;
  double enterMax;
  double enterVal;
  double enterLB;
  double enterUB;
  double enterTest;
  SPxId none;
  SPxSolverBase<double> *this_01;
  SPxStatus stat;
  SPxSolverBase<double> *this_02;
  SPxSolverBase<double> *this_03;
  SSVectorBase<double> *x;
  SPxSolverBase<double> *in_stack_fffffffffffffce0;
  SSVectorBase<double> *in_stack_fffffffffffffce8;
  SPxSolverBase<double> *in_stack_fffffffffffffcf0;
  SSVectorBase<double> *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  uint uVar16;
  SPxSolverBase<double> *in_stack_fffffffffffffd38;
  DataKey in_stack_fffffffffffffd40;
  undefined8 uVar17;
  undefined4 local_178;
  Verbosity local_174 [15];
  undefined4 local_138;
  Verbosity local_134;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  double local_110;
  double local_e8;
  SPxRowId local_e0;
  SPxColId local_d8;
  double local_d0;
  int local_c8;
  DataKey local_c4;
  uint local_bc;
  Real local_b8;
  undefined8 local_ac;
  undefined8 local_a4;
  byte local_99;
  undefined8 local_98;
  undefined1 local_90 [28];
  undefined1 local_74 [12];
  undefined1 local_68 [8];
  Item *local_60;
  Nonzero<double> *local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_3c [11];
  byte local_31;
  SPxId *local_30;
  
  local_31 = in_DL & 1;
  local_30 = in_RSI;
  SPxId::SPxId((SPxId *)0x274974);
  StableSum<double>::StableSum((StableSum<double> *)local_90);
  iVar5 = (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7e])(in_RDI,local_30);
  local_98 = CONCAT44(extraout_var,iVar5);
  local_99 = in_RDI->instableEnter & 1;
  local_a4._0_4_ = (local_30->super_DataKey).info;
  local_a4._4_4_ = (local_30->super_DataKey).idx;
  this_01 = (SPxSolverBase<double> *)local_68;
  this_02 = (SPxSolverBase<double> *)(local_74 + 4);
  pSVar11 = (SSVectorBase<double> *)local_74;
  this_03 = (SPxSolverBase<double> *)(local_90 + 0x10);
  x = (SSVectorBase<double> *)local_90;
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x81])
            (in_RDI,local_a4,&local_48,&local_50,&local_58,&local_60);
  _Var3._M_pi = local_48._M_pi;
  if (((local_31 & 1) == 0) &&
     (dVar12 = epsilon((SPxSolverBase<double> *)0x274a6a), -dVar12 < (double)_Var3._M_pi)) {
    local_ac._0_4_ = (local_30->super_DataKey).info;
    local_ac._4_4_ = (local_30->super_DataKey).idx;
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x84])
              (local_48._M_pi,in_RDI,local_ac,(ulong)(uint)local_74._0_4_);
    (**(in_RDI->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
              (&in_RDI->super_SPxBasisBase<double>,0xffffffff,local_3c,0);
    SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[38],_0>
              (in_RDI,(char (*) [38])"DENTER08 rejecting false enter pivot\n");
    return false;
  }
  this_00 = UpdateVector<double>::delta(in_RDI->theFvec);
  bVar4 = SSVectorBase<double>::isSetup(this_00);
  if (bVar4) {
    UpdateVector<double>::delta(in_RDI->theFvec);
    iVar5 = SSVectorBase<double>::size((SSVectorBase<double> *)0x274b62);
    if (iVar5 == 0) {
      UpdateVector<double>::delta(in_RDI->theFvec);
      SPxBasisBase<double>::solve4update
                ((SPxBasisBase<double> *)this_03,pSVar11,(SVectorBase<double> *)this_02);
    }
  }
  if (((local_31 & 1) == 0) && (in_RDI->m_maxCycle < in_RDI->m_numCycle)) {
    if (-(double)local_68 <= 0.0) {
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x89])();
    }
    else {
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x8a])();
    }
  }
  local_b8 = -(double)local_68;
  in_RDI->boundflips = 0;
  local_bc = (*in_RDI->theratiotester->_vptr_SPxRatioTester[7])
                       (local_48._M_pi,in_RDI->theratiotester,&local_b8,(ulong)local_31 & 1);
  in_RDI->instableEnterVal = 0.0;
  SPxId::SPxId((SPxId *)0x274ca3);
  (in_RDI->instableEnterId).super_DataKey = local_c4;
  in_RDI->instableEnter = false;
  if ((int)local_bc < 0) {
    tolerances(in_RDI);
    peVar9 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2759a1);
    Tolerances::epsilon(peVar9);
    bVar4 = NE<double,double,double>((double)this_02,(double)this_01,1.27413453055014e-317);
    RVar13 = local_b8;
    if (bVar4) {
      if ((local_99 & 1) == 0) {
        (in_RDI->instableEnterId).super_DataKey = *(DataKey *)&(local_30->super_DataKey).info;
        in_RDI->instableEnterVal = (double)local_48._M_pi;
        SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[55],_0>
                  (in_RDI,(char (*) [55])"DENTER09 rejecting enter pivot and looking for others\n");
        local_118._0_4_ = (local_30->super_DataKey).info;
        local_118._4_4_ = (local_30->super_DataKey).idx;
        (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x84])
                  ((double)local_48._M_pi / 10.0,in_RDI,local_118,(ulong)(uint)local_74._0_4_);
        (**(in_RDI->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                  (&in_RDI->super_SPxBasisBase<double>,0xffffffff,local_3c,0);
      }
      else {
        SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[68],_0>
                  (in_RDI,(char (*) [68])
                          "DENTER10 rejecting enter pivot in instable state, resetting values\n");
        local_120._0_4_ = (local_30->super_DataKey).info;
        local_120._4_4_ = (local_30->super_DataKey).idx;
        (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x84])
                  (local_48._M_pi,in_RDI,local_120,(ulong)(uint)local_74._0_4_);
        (**(in_RDI->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                  (&in_RDI->super_SPxBasisBase<double>,0xffffffff,local_3c,0);
      }
      return false;
    }
    if ((((local_31 & 1) == 0) &&
        (pdVar10 = (double *)infinity(), RVar1 = local_b8, RVar13 < *pdVar10)) &&
       (pdVar10 = (double *)infinity(), -*pdVar10 < RVar1)) {
      (**(in_RDI->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                (&in_RDI->super_SPxBasisBase<double>,0xffffffff,local_30,local_98,0);
      RVar13 = local_b8;
      pdVar10 = UpdateVector<double>::value(in_RDI->theFvec);
      *pdVar10 = RVar13;
      UpdateVector<double>::update((UpdateVector<double> *)0x275c01);
      local_128._0_4_ = (local_30->super_DataKey).info;
      local_128._4_4_ = (local_30->super_DataKey).idx;
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x83])
                (local_b8,in_RDI,local_128,(ulong)(uint)local_74._0_4_,local_98,local_90);
      StableSum::operator_cast_to_double((StableSum *)local_90);
      updateNonbasicValue(in_stack_fffffffffffffce0,(double)x);
      SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[63],_0>
                (in_RDI,(char (*) [63])
                        "DENTER11 moving entering variable from one bound to the other\n");
      return false;
    }
    local_130._0_4_ = (local_30->super_DataKey).info;
    local_130._4_4_ = (local_30->super_DataKey).idx;
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x84])
              (local_48._M_pi,in_RDI,local_130,(ulong)(uint)local_74._0_4_);
    (**(in_RDI->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
              (&in_RDI->super_SPxBasisBase<double>,0xffffffff,local_3c,0);
    if ((local_31 & 1) != 0) {
      return false;
    }
    iVar5 = SPxBasisBase<double>::lastUpdate(&in_RDI->super_SPxBasisBase<double>);
    if (1 < iVar5) {
      if ((in_RDI->spxout != (SPxOut *)0x0) &&
         (VVar7 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar7)) {
        local_134 = SPxOut::getVerbosity(in_RDI->spxout);
        local_138 = 5;
        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_138);
        soplex::operator<<((SPxOut *)this_02,(char *)this_01);
        soplex::operator<<((SPxOut *)this_02,(char *)this_01);
        soplex::operator<<((SPxOut *)this_02,(_func_ostream_ptr_ostream_ptr *)this_01);
        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_134);
      }
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x75])();
      return false;
    }
    RVar13 = spxAbs<double>((Real)local_48._M_pi);
    dVar12 = entertol(this_01);
    if (RVar13 < dVar12) {
      if ((in_RDI->spxout != (SPxOut *)0x0) &&
         (VVar7 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar7)) {
        local_174[2] = SPxOut::getVerbosity(in_RDI->spxout);
        local_174[1] = 5;
        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_174 + 1);
        soplex::operator<<((SPxOut *)this_02,(char *)this_01);
        soplex::operator<<((SPxOut *)this_02,(_func_ostream_ptr_ostream_ptr *)this_01);
        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_174 + 2);
      }
      SPxBasisBase<double>::coSolve
                ((SPxBasisBase<double> *)this_03,(VectorBase<double> *)pSVar11,
                 (VectorBase<double> *)this_02);
      computePvec(this_03);
      computeCoTest((SPxSolverBase<double> *)in_stack_fffffffffffffd40);
      computeTest((SPxSolverBase<double> *)in_stack_fffffffffffffd40);
      return false;
    }
    if ((in_RDI->spxout != (SPxOut *)0x0) &&
       (VVar7 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar7)) {
      local_174[0] = SPxOut::getVerbosity(in_RDI->spxout);
      local_178 = 5;
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_178);
      soplex::operator<<((SPxOut *)this_02,(char *)this_01);
      soplex::operator<<((SPxOut *)this_02,(char *)this_01);
      soplex::operator<<((SPxOut *)this_02,(_func_ostream_ptr_ostream_ptr *)this_01);
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_174);
    }
    stat = (SPxStatus)((ulong)this_01 >> 0x20);
    RVar8 = rep(in_RDI);
    if (RVar8 == ROW) {
      computeDualfarkas4Row
                (in_stack_fffffffffffffd38,
                 (double)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 (SPxId)in_stack_fffffffffffffd40);
      setBasisStatus(this_02,stat);
    }
    else {
      computePrimalray4Col
                (in_stack_fffffffffffffd38,
                 (double)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 (SPxId)in_stack_fffffffffffffd40);
      setBasisStatus(this_02,stat);
    }
    return false;
  }
  RVar13 = spxAbs<double>(local_b8);
  dVar12 = entertol(this_01);
  if (dVar12 <= RVar13) {
    in_RDI->m_numCycle = in_RDI->m_numCycle / 2;
  }
  else {
    VectorBase<double>::operator[]((VectorBase<double> *)this_02,(int)((ulong)this_01 >> 0x20));
    VectorBase<double>::operator[]((VectorBase<double> *)this_02,(int)((ulong)this_01 >> 0x20));
    tolerances(in_RDI);
    peVar9 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x274d6b);
    Tolerances::epsilon(peVar9);
    bVar4 = NE<double,double,double>((double)this_02,(double)this_01,1.27259304573511e-317);
    if (((bVar4) && (local_74._0_4_ != 0xffffffff)) && (local_74._0_4_ != 1)) {
      in_RDI->m_numCycle = in_RDI->m_numCycle + 1;
      in_RDI->enterCycles = in_RDI->enterCycles + 1;
    }
  }
  if ((in_RDI->coSolveVector3 == (SSVectorBase<double> *)0x0) ||
     (in_RDI->coSolveVector2 == (SSVectorBase<double> *)0x0)) {
    if (in_RDI->coSolveVector3 == (SSVectorBase<double> *)0x0) {
      if (in_RDI->coSolveVector2 == (SSVectorBase<double> *)0x0) {
        UpdateVector<double>::delta(in_RDI->theCoPvec);
        Array<soplex::UnitVectorBase<double>_>::operator[]
                  ((Array<soplex::UnitVectorBase<double>_> *)this_02,(int)((ulong)this_01 >> 0x20));
        SPxBasisBase<double>::coSolve
                  ((SPxBasisBase<double> *)this_03,pSVar11,(SVectorBase<double> *)this_02);
      }
      else {
        UpdateVector<double>::delta(in_RDI->theCoPvec);
        Array<soplex::UnitVectorBase<double>_>::operator[]
                  ((Array<soplex::UnitVectorBase<double>_> *)this_02,(int)((ulong)this_01 >> 0x20));
        SPxBasisBase<double>::coSolve
                  ((SPxBasisBase<double> *)in_stack_fffffffffffffce0,x,
                   (SSVectorBase<double> *)this_03,(SVectorBase<double> *)pSVar11,
                   (SSVectorBase<double> *)this_02);
      }
    }
    else {
      UpdateVector<double>::delta(in_RDI->theCoPvec);
      Array<soplex::UnitVectorBase<double>_>::operator[]
                ((Array<soplex::UnitVectorBase<double>_> *)this_02,(int)((ulong)this_01 >> 0x20));
      SPxBasisBase<double>::coSolve
                ((SPxBasisBase<double> *)in_stack_fffffffffffffce0,x,(SSVectorBase<double> *)this_03
                 ,(SVectorBase<double> *)pSVar11,(SSVectorBase<double> *)this_02);
      VectorBase<double>::operator-=((VectorBase<double> *)in_stack_fffffffffffffce0,x);
    }
  }
  else {
    UpdateVector<double>::delta(in_RDI->theCoPvec);
    Array<soplex::UnitVectorBase<double>_>::operator[]
              ((Array<soplex::UnitVectorBase<double>_> *)this_02,(int)((ulong)this_01 >> 0x20));
    this_01 = (SPxSolverBase<double> *)in_RDI->coSolveVector3rhs;
    SPxBasisBase<double>::coSolve
              ((SPxBasisBase<double> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
               (SSVectorBase<double> *)in_stack_fffffffffffffce0,x,(SVectorBase<double> *)this_03,
               pSVar11,in_stack_fffffffffffffd00);
    VectorBase<double>::operator-=((VectorBase<double> *)in_stack_fffffffffffffce0,x);
  }
  if (0 < in_RDI->boundflips) {
    local_c8 = SSVectorBase<double>::dim((SSVectorBase<double> *)0x2750d4);
    while (local_c8 = local_c8 + -1, -1 < local_c8) {
      dVar12 = SSVectorBase<double>::operator[]
                         ((SSVectorBase<double> *)this_02,(int)((ulong)this_01 >> 0x20));
      RVar13 = spxAbs<double>(dVar12);
      dVar12 = epsilon((SPxSolverBase<double> *)0x275122);
      if (dVar12 < RVar13) {
        local_d0 = SSVectorBase<double>::operator[]
                             ((SSVectorBase<double> *)this_02,(int)((ulong)this_01 >> 0x20));
        local_d0 = -local_d0;
        SVSetBase<double>::operator[]((SVSetBase<double> *)this_02,(int)((ulong)this_01 >> 0x20));
        VectorBase<double>::multAdd<double,double>
                  ((VectorBase<double> *)in_stack_fffffffffffffce0,(double *)x,
                   (SVectorBase<double> *)this_03);
      }
    }
    bVar4 = SPxId::isSPxColId(local_30);
    if (bVar4) {
      SPxColId::SPxColId(&local_d8,local_30);
      SPxLPBase<double>::number(&this_02->super_SPxLPBase<double>,(SPxColId *)this_01);
      pdVar10 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)this_02,(int)((ulong)this_01 >> 0x20));
      local_74._4_8_ = *pdVar10;
    }
    else {
      SPxRowId::SPxRowId(&local_e0,local_30);
      SPxLPBase<double>::number(&this_02->super_SPxLPBase<double>,(SPxRowId *)this_01);
      pdVar10 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)this_02,(int)((ulong)this_01 >> 0x20));
      local_74._4_8_ = *pdVar10;
    }
    SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[51],_int_&,_0>
              (in_RDI,(char (*) [51])"IEBFRT02 breakpoints passed / bounds flipped = {}\n",
               &in_RDI->boundflips);
    in_RDI->totalboundflips = in_RDI->boundflips + in_RDI->totalboundflips;
  }
  uVar17 = local_90._16_8_;
  iVar5 = (int)((ulong)this_01 >> 0x20);
  pdVar10 = VectorBase<double>::operator[]((VectorBase<double> *)this_02,iVar5);
  *pdVar10 = (double)uVar17;
  dVar12 = (double)local_90._16_8_ - (double)local_74._4_8_;
  UpdateVector<double>::delta(in_RDI->theFvec);
  dVar14 = SSVectorBase<double>::operator[]((SSVectorBase<double> *)this_02,iVar5);
  pdVar10 = UpdateVector<double>::value(in_RDI->theCoPvec);
  *pdVar10 = dVar12 / dVar14;
  pdVar10 = UpdateVector<double>::value(in_RDI->theCoPvec);
  dVar12 = *pdVar10;
  dVar14 = epsilon((SPxSolverBase<double> *)0x2753b6);
  if (dVar12 <= dVar14) {
    pdVar10 = UpdateVector<double>::value(in_RDI->theCoPvec);
    dVar12 = *pdVar10;
    dVar14 = epsilon((SPxSolverBase<double> *)0x2753f6);
    if (-dVar14 <= dVar12) goto LAB_00275495;
  }
  PVar6 = pricing(in_RDI);
  if (PVar6 == FULL) {
    pdVar10 = UpdateVector<double>::value(in_RDI->theCoPvec);
    dVar12 = *pdVar10;
    pdVar10 = UpdateVector<double>::value(in_RDI->thePvec);
    *pdVar10 = dVar12;
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x86])();
  }
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x87])();
LAB_00275495:
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x82])
            (local_68,in_RDI,(ulong)local_bc,&local_e8,local_90);
  pdVar10 = VectorBase<double>::operator[]((VectorBase<double> *)this_02,iVar5);
  *pdVar10 = (double)local_50;
  pdVar10 = VectorBase<double>::operator[]((VectorBase<double> *)this_02,iVar5);
  *pdVar10 = (double)local_58;
  updateCoTest(in_stack_fffffffffffffcf0);
  PVar6 = pricing(in_RDI);
  if (PVar6 == FULL) {
    updateTest(in_stack_fffffffffffffcf0);
  }
  RVar13 = local_b8;
  pdVar10 = UpdateVector<double>::value(in_RDI->theFvec);
  *pdVar10 = RVar13;
  UpdateVector<double>::update((UpdateVector<double> *)0x2756f7);
  dVar14 = (double)local_60 - local_b8;
  pdVar10 = VectorBase<double>::operator[]((VectorBase<double> *)this_02,iVar5);
  dVar12 = local_e8;
  *pdVar10 = dVar14;
  dVar15 = epsilon((SPxSolverBase<double> *)0x275759);
  dVar14 = local_e8;
  if ((dVar15 < dVar12) || (dVar12 = epsilon((SPxSolverBase<double> *)0x27578a), dVar14 < -dVar12))
  {
    local_110 = -local_e8;
    SPxBasisBase<double>::baseVec((SPxBasisBase<double> *)this_02,iVar5);
    VectorBase<double>::multAdd<double,double>
              ((VectorBase<double> *)in_stack_fffffffffffffce0,(double *)x,
               (SVectorBase<double> *)this_03);
  }
  pIVar2 = local_60;
  dVar12 = epsilon((SPxSolverBase<double> *)0x27583a);
  if ((dVar12 < (double)pIVar2) ||
     (dVar12 = epsilon((SPxSolverBase<double> *)0x27586b), (double)local_60 < -dVar12)) {
    VectorBase<double>::multAdd<double,double>
              ((VectorBase<double> *)in_stack_fffffffffffffce0,(double *)x,
               (SVectorBase<double> *)this_03);
  }
  StableSum::operator_cast_to_double((StableSum *)local_90);
  updateNonbasicValue(in_stack_fffffffffffffce0,(double)x);
  uVar16 = local_bc;
  uVar17 = local_98;
  pSVar11 = UpdateVector<double>::delta(in_RDI->theFvec);
  (**(in_RDI->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
            (&in_RDI->super_SPxBasisBase<double>,(ulong)uVar16,local_30,uVar17,pSVar11);
  return true;
}

Assistant:

bool SPxSolverBase<R>::enter(SPxId& enterId, bool polish)
{
   assert(enterId.isValid());
   assert(type() == ENTER);
   assert(initialized);

   SPxId none;          // invalid id used when enter fails
   R enterTest;      // correct test value of entering var
   R enterUB;        // upper bound of entering variable
   R enterLB;        // lower bound of entering variable
   R enterVal;       // current value of entering variable
   R enterMax;       // maximum value for entering shift
   R enterPric;      // priced value of entering variable
   typename SPxBasisBase<R>::Desc::Status enterStat;      // status of entering variable
   R enterRO;        // rhs/obj of entering variable
   StableSum<R> objChange;
   const SVectorBase<R>* enterVec = enterVector(enterId);

   bool instable = instableEnter;
   assert(!instable || instableEnterId.isValid());

   getEnterVals(enterId, enterTest, enterUB, enterLB,
                enterVal, enterMax, enterPric, enterStat, enterRO, objChange);

   if(!polish && enterTest > -epsilon())
   {
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      SPxOut::debug(this, "DENTER08 rejecting false enter pivot\n");

      return false;
   }

   /*  Before performing the actual basis update, we must determine, how this
       is to be accomplished.
   */
   // BH 2005-11-15: Obviously solve4update() is only called if theFvec.delta()
   // is setup (i.e. the indices of the NZEs are stored within it) and there are
   // 0 NZEs (???).
   // In that case theFvec->delta() is set such that
   //   Base * theFvec->delta() = enterVec
   if(theFvec->delta().isSetup() && theFvec->delta().size() == 0)
      SPxBasisBase<R>::solve4update(theFvec->delta(), *enterVec);

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      // BH 2005-11-29: This code block seems to check the assertion
      //   || Base * theFvec->delta() - enterVec ||_2 <= entertol()
      VectorBase<R> tmp(dim());
      // BH 2005-11-15: This cast is necessary since SSVectorBase<R>  inherits protected from VectorBase<R>.
      tmp = reinterpret_cast<VectorBase<R>&>(theFvec->delta());
      this->multBaseWith(tmp);
      tmp -= *enterVec;

      if(tmp.length() > entertol())
      {
         // This happens frequently and does usually not hurt, so print these
         // warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WENTER09 fVec updated error = "
                       << tmp.length() << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(-enterMax > 0)
         perturbMaxEnter();
      else
         perturbMinEnter();
   }

   R leaveVal = -enterMax;

   boundflips = 0;
   int leaveIdx = theratiotester->selectLeave(leaveVal, enterTest, polish);

   /* in row representation, fixed columns and rows should not leave the basis */
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxColId()
          || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxRowId()
          || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);

   instableEnterVal = 0;
   instableEnterId = SPxId();
   instableEnter = false;

   /*
     We now tried to find a variable to leave the basis. If one has been
     found, a regular basis update is to be performed.
   */
   if(leaveIdx >= 0)
   {
      if(spxAbs(leaveVal) < entertol())
      {
         if(NE(theUBbound[leaveIdx], theLBbound[leaveIdx], this->tolerances()->epsilon())
               && enterStat != SPxBasisBase<R>::Desc::P_FREE && enterStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            enterCycles++;
         }
      }
      else
         m_numCycle /= 2;

      // setup for updating the copricing vector
      if(coSolveVector3 && coSolveVector2)
      {
         assert(coSolveVector2->isConsistent());
         assert(coSolveVector2rhs->isSetup());
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, *coSolveVector3
                                  , unitVecs[leaveIdx], *coSolveVector2rhs, *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector3)
      {
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector3, unitVecs[leaveIdx],
                                  *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector2)
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, unitVecs[leaveIdx],
                                  *coSolveVector2rhs);
      else
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);

      if(boundflips > 0)
      {
         for(int i = coSolveVector3->dim() - 1; i >= 0; --i)
         {
            if(spxAbs((*coSolveVector3)[i]) > epsilon())
               (*thePvec).multAdd(-(*coSolveVector3)[i], (*thecovectors)[i]);
         }

         // we need to update enterPric in case it was changed by bound flips
         if(enterId.isSPxColId())
            enterPric = (*theCoPvec)[this->number(SPxColId(enterId))];
         else
            enterPric = (*thePvec)[this->number(SPxRowId(enterId))];

         SPxOut::debug(this, "IEBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
         totalboundflips += boundflips;
      }

      (*theCoPrhs)[leaveIdx] = enterRO;
      theCoPvec->value() = (enterRO - enterPric) / theFvec->delta()[leaveIdx];

      if(theCoPvec->value() > epsilon() || theCoPvec->value() < -epsilon())
      {
         if(pricing() == FULL)
         {
            thePvec->value() = theCoPvec->value();
            setupPupdate();
         }

         doPupdate();
      }

      assert(thePvec->isConsistent());
      assert(theCoPvec->isConsistent());

      assert(!this->baseId(leaveIdx).isSPxRowId()
             || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);
      assert(!this->baseId(leaveIdx).isSPxColId()
             || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);

      R leavebound;             // bound on which leaving variable moves

      try
      {
         getEnterVals2(leaveIdx, enterMax, leavebound, objChange);
      }
      catch(const SPxException& F)
      {
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
         throw F;
      }

      //  process entering variable
      theUBbound[leaveIdx] = enterUB;
      theLBbound[leaveIdx] = enterLB;

      //  compute tests:
      updateCoTest();

      if(pricing() == FULL)
         updateTest();

      // update feasibility vectors
      theFvec->value() = leaveVal;
      theFvec->update();
      (*theFvec)[leaveIdx] = enterVal - leaveVal;

      if(leavebound > epsilon() || leavebound < -epsilon())
         theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

      if(enterVal > epsilon() || enterVal < -epsilon())
         theFrhs->multAdd(enterVal, *enterVec);

      // update objective funtion value
      updateNonbasicValue(objChange);

      //  change basis matrix
      this->change(leaveIdx, enterId, enterVec, &(theFvec->delta()));

      return true;
   }
   /*  No leaving vector could be found that would yield a stable pivot step.
    */
   else if(NE(leaveVal, -enterMax, this->tolerances()->epsilon()))
   {
      /* In the ENTER algorithm, when for a selected entering variable we find only
         an instable leaving variable, then the basis change is not conducted.
         Instead, we save the entering variable's id in instableEnterId and set
         the test value to zero, hoping to find a different leaving
         variable with a stable leavingvariable.
         If this fails, however, and no more entering variable is found, we have to
         perform the instable basis change using instableEnterId. In this (and only
         in this) case, the flag instableEnter is set to true.

         leaveVal != enterMax is the case that selectLeave has found only an instable leaving
         variable. We store this leaving variable for later if we are not already in the
         instable case */

      if(!instable)
      {
         instableEnterId = enterId;
         instableEnterVal = enterTest;

         SPxOut::debug(this, "DENTER09 rejecting enter pivot and looking for others\n");

         rejectEnter(enterId, enterTest / 10.0, enterStat);
         this->change(-1, none, nullptr);
      }
      else
      {
         SPxOut::debug(this, "DENTER10 rejecting enter pivot in instable state, resetting values\n");
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
      }

      return false;
   }
   /*  No leaving vector has been selected from the basis. However, if the
       shift amount for |fVec| is bounded, we are in the case, that the
       entering variable is moved from one bound to its other, before any of
       the basis feasibility variables reaches their bound. This may only
       happen in primal/columnwise case with upper and lower bounds on
       variables.
   */
   else if(!polish && leaveVal < R(infinity) && leaveVal > R(-infinity))
   {
      assert(rep() == COLUMN);
      assert(EQ(leaveVal, -enterMax, this->epsilon()));

      this->change(-1, enterId, enterVec);

      theFvec->value() = leaveVal;
      theFvec->update();

      ungetEnterVal(enterId, enterStat, leaveVal, *enterVec, objChange);

      // update objective funtion value
      updateNonbasicValue(objChange);

      SPxOut::debug(this, "DENTER11 moving entering variable from one bound to the other\n");

      return false;
   }
   /*  No variable could be selected to leave the basis and even the entering
       variable is unbounded --- this is a failure.
   */
   else
   {
      /* The following line originally was in the "lastUpdate() > 1" case;
         we need it in the INFEASIBLE/UNBOUNDED case, too, to have the
         basis descriptor at the correct size.
      */
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      if(polish)
         return false;

      else if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER01 factorization triggered in "
                       << "enter() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the entering column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return false;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation
       * ROW: recompute the primal variables and activities for another, more precise, round of pricing
       */
      else if(spxAbs(enterTest) < entertol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "IENTER11 clean up step to reduce numerical errors" <<
                       std::endl;)

         SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
         computePvec();
         computeCoTest();
         computeTest();

         return false;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER02 unboundedness/infeasibility found in "
                    << "enter()" << std::endl;)

      if(rep() == ROW)
      {
         computeDualfarkas4Row(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }
      /**@todo if shift() is not zero, we must not conclude primal unboundedness */
      else
      {
         computePrimalray4Col(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }

      return false;
   }
}